

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_decoder_init_memory
                    (void *pData,size_t dataSize,ma_decoder_config *pConfig,ma_decoder *pDecoder)

{
  ma_uint64 *__s;
  ma_allocation_callbacks *pDst;
  _func_void_void_ptr_ma_data_source_ptr_ma_allocation_callbacks_ptr *p_Var1;
  ma_result mVar2;
  uint uVar3;
  ma_decoding_backend_vtable *pmVar4;
  ma_decoder_config *pConfig_00;
  ma_data_source_base *pDataSourceBase;
  ma_decoder *pDecoder_00;
  ulong uVar5;
  ma_data_source *pBackend;
  ma_decoder_config config;
  ma_decoder_config config_1;
  ma_data_source *local_160;
  undefined1 local_158 [112];
  ma_encoding_format local_e8;
  ma_decoding_backend_vtable **local_e0;
  uint local_d8;
  void *local_d0;
  ma_uint64 *local_c8;
  ma_decoding_backend_config local_c0 [18];
  
  if (pConfig == (ma_decoder_config *)0x0) {
    memset(local_c0,0,0x90);
  }
  else {
    memcpy(local_c0,pConfig,0x90);
  }
  memcpy(local_158,local_c0,0x90);
  if (pDecoder == (ma_decoder *)0x0) {
    return MA_INVALID_ARGS;
  }
  __s = &(pDecoder->ds).rangeBegInFrames;
  memset(__s,0,0x220);
  (pDecoder->ds).vtable = &g_ma_decoder_data_source_vtable;
  (pDecoder->ds).rangeEndInFrames = 0xffffffffffffffff;
  (pDecoder->ds).loopEndInFrames = 0xffffffffffffffff;
  (pDecoder->ds).pCurrent = pDecoder;
  (pDecoder->ds).pNext = (ma_data_source *)0x0;
  (pDecoder->ds).onGetNext = (ma_data_source_get_next_proc)0x0;
  pDst = &pDecoder->allocationCallbacks;
  pDecoder->onRead = (ma_decoder_read_proc)0x0;
  pDecoder->onSeek = (ma_decoder_seek_proc)0x0;
  pDecoder->onTell = (ma_decoder_tell_proc)0x0;
  pDecoder->pUserData = (void *)0x0;
  mVar2 = ma_allocation_callbacks_init_copy(pDst,(ma_allocation_callbacks *)(local_158 + 0x50));
  if (mVar2 != MA_SUCCESS) {
    return mVar2;
  }
  if (dataSize == 0 || pData == (void *)0x0) {
    return MA_INVALID_ARGS;
  }
  local_c8 = __s;
  if (local_e8 != ma_encoding_format_unknown) {
    mVar2 = MA_NO_BACKEND;
    if (local_e8 == ma_encoding_format_wav) {
      if (g_ma_decoding_backend_vtable_wav.onInitMemory ==
          (_func_ma_result_void_ptr_void_ptr_size_t_ma_decoding_backend_config_ptr_ma_allocation_callbacks_ptr_ma_data_source_ptr_ptr
           *)0x0) {
        mVar2 = MA_NOT_IMPLEMENTED;
      }
      else {
        mVar2 = (*g_ma_decoding_backend_vtable_wav.onInitMemory)
                          ((void *)0x0,pData,dataSize,local_c0,pDst,&local_160);
        if (mVar2 == MA_SUCCESS) {
          pDecoder->pBackend = local_160;
          pDecoder->pBackendVTable = &g_ma_decoding_backend_vtable_wav;
          pDecoder->pBackendUserData = local_d0;
          mVar2 = MA_SUCCESS;
        }
      }
    }
    if (local_e8 == ma_encoding_format_flac) {
      if (g_ma_decoding_backend_vtable_flac.onInitMemory ==
          (_func_ma_result_void_ptr_void_ptr_size_t_ma_decoding_backend_config_ptr_ma_allocation_callbacks_ptr_ma_data_source_ptr_ptr
           *)0x0) {
        mVar2 = MA_NOT_IMPLEMENTED;
      }
      else {
        mVar2 = (*g_ma_decoding_backend_vtable_flac.onInitMemory)
                          ((void *)0x0,pData,dataSize,local_c0,pDst,&local_160);
        if (mVar2 == MA_SUCCESS) {
          pDecoder->pBackend = local_160;
          pDecoder->pBackendVTable = &g_ma_decoding_backend_vtable_flac;
          pDecoder->pBackendUserData = local_d0;
          mVar2 = MA_SUCCESS;
        }
      }
    }
    if (local_e8 == ma_encoding_format_mp3) {
      if (g_ma_decoding_backend_vtable_mp3.onInitMemory ==
          (_func_ma_result_void_ptr_void_ptr_size_t_ma_decoding_backend_config_ptr_ma_allocation_callbacks_ptr_ma_data_source_ptr_ptr
           *)0x0) {
        mVar2 = MA_NOT_IMPLEMENTED;
      }
      else {
        mVar2 = (*g_ma_decoding_backend_vtable_mp3.onInitMemory)
                          ((void *)0x0,pData,dataSize,local_c0,pDst,&local_160);
        if (mVar2 == MA_SUCCESS) {
          pDecoder->pBackend = local_160;
          pDecoder->pBackendVTable = &g_ma_decoding_backend_vtable_mp3;
          pDecoder->pBackendUserData = local_d0;
          mVar2 = MA_SUCCESS;
        }
      }
    }
    if (local_e8 == ma_encoding_format_vorbis) {
      if (g_ma_decoding_backend_vtable_stbvorbis.onInitMemory ==
          (_func_ma_result_void_ptr_void_ptr_size_t_ma_decoding_backend_config_ptr_ma_allocation_callbacks_ptr_ma_data_source_ptr_ptr
           *)0x0) {
        mVar2 = MA_NOT_IMPLEMENTED;
      }
      else {
        mVar2 = (*g_ma_decoding_backend_vtable_stbvorbis.onInitMemory)
                          ((void *)0x0,pData,dataSize,local_c0,pDst,&local_160);
        if (mVar2 == MA_SUCCESS) {
          pDecoder->pBackend = local_160;
          pDecoder->pBackendVTable = &g_ma_decoding_backend_vtable_stbvorbis;
          pDecoder->pBackendUserData = local_d0;
          mVar2 = MA_SUCCESS;
        }
      }
    }
    if (mVar2 == MA_SUCCESS) goto LAB_0016f16c;
  }
  if ((local_e0 != (ma_decoding_backend_vtable **)0x0) && (local_d8 != 0)) {
    uVar5 = 0;
    uVar3 = local_d8;
    do {
      pmVar4 = local_e0[uVar5];
      if (((pmVar4 != (ma_decoding_backend_vtable *)0x0) &&
          (pmVar4->onInitMemory !=
           (_func_ma_result_void_ptr_void_ptr_size_t_ma_decoding_backend_config_ptr_ma_allocation_callbacks_ptr_ma_data_source_ptr_ptr
            *)0x0)) &&
         (mVar2 = (*pmVar4->onInitMemory)(local_d0,pData,dataSize,local_c0,pDst,&local_160),
         uVar3 = local_d8, mVar2 == MA_SUCCESS)) {
        pDecoder->pBackend = local_160;
        pDecoder->pBackendVTable = pmVar4;
        goto LAB_0016f160;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar3);
  }
  if (local_e8 != ma_encoding_format_unknown) {
    return MA_NO_BACKEND;
  }
  if ((g_ma_decoding_backend_vtable_wav.onInitMemory ==
       (_func_ma_result_void_ptr_void_ptr_size_t_ma_decoding_backend_config_ptr_ma_allocation_callbacks_ptr_ma_data_source_ptr_ptr
        *)0x0) ||
     (mVar2 = (*g_ma_decoding_backend_vtable_wav.onInitMemory)
                        ((void *)0x0,pData,dataSize,local_c0,pDst,&local_160), mVar2 != MA_SUCCESS))
  {
    if ((g_ma_decoding_backend_vtable_flac.onInitMemory ==
         (_func_ma_result_void_ptr_void_ptr_size_t_ma_decoding_backend_config_ptr_ma_allocation_callbacks_ptr_ma_data_source_ptr_ptr
          *)0x0) ||
       (mVar2 = (*g_ma_decoding_backend_vtable_flac.onInitMemory)
                          ((void *)0x0,pData,dataSize,local_c0,pDst,&local_160), mVar2 != MA_SUCCESS
       )) {
      mVar2 = ma_decoder_init_from_memory__internal
                        (&g_ma_decoding_backend_vtable_mp3,(void *)0x0,pData,dataSize,
                         (ma_decoder_config *)local_158,pDecoder);
      if (mVar2 != MA_SUCCESS) {
        pDecoder_00 = (ma_decoder *)local_158;
        pConfig_00 = (ma_decoder_config *)dataSize;
        mVar2 = ma_decoder_init_from_memory__internal
                          (&g_ma_decoding_backend_vtable_stbvorbis,(void *)0x0,pData,dataSize,
                           (ma_decoder_config *)pDecoder_00,pDecoder);
        if (mVar2 != MA_SUCCESS) {
          memset(local_c8,0,0x220);
          (pDecoder->ds).vtable = &g_ma_decoder_data_source_vtable;
          (pDecoder->ds).rangeEndInFrames = 0xffffffffffffffff;
          (pDecoder->ds).loopEndInFrames = 0xffffffffffffffff;
          (pDecoder->ds).pCurrent = pDecoder;
          (pDecoder->ds).pNext = (ma_data_source *)0x0;
          (pDecoder->ds).onGetNext = (ma_data_source_get_next_proc)0x0;
          pDecoder->onRead = ma_decoder__on_read_memory;
          pDecoder->onSeek = ma_decoder__on_seek_memory;
          pDecoder->onTell = ma_decoder__on_tell_memory;
          mVar2 = ma_allocation_callbacks_init_copy
                            (pDst,(ma_allocation_callbacks *)(local_158 + 0x50));
          if (mVar2 != MA_SUCCESS) {
            return mVar2;
          }
          (pDecoder->data).vfs.pVFS = pData;
          (pDecoder->data).memory.dataSize = dataSize;
          (pDecoder->data).memory.currentReadPos = 0;
          mVar2 = ma_decoder_init__internal
                            (ma_decoder__on_seek_memory,(ma_decoder_seek_proc)local_158,pDecoder,
                             pConfig_00,pDecoder_00);
          if (mVar2 == MA_SUCCESS) {
            return MA_SUCCESS;
          }
          return mVar2;
        }
      }
      goto LAB_0016f16c;
    }
    pDecoder->pBackend = local_160;
    pmVar4 = &g_ma_decoding_backend_vtable_flac;
  }
  else {
    pDecoder->pBackend = local_160;
    pmVar4 = &g_ma_decoding_backend_vtable_wav;
  }
  pDecoder->pBackendVTable = pmVar4;
LAB_0016f160:
  pDecoder->pBackendUserData = local_d0;
LAB_0016f16c:
  mVar2 = ma_decoder__postinit((ma_decoder_config *)local_158,pDecoder);
  if (mVar2 == MA_SUCCESS) {
    return MA_SUCCESS;
  }
  if (pDecoder->pBackendVTable != (ma_decoding_backend_vtable *)0x0) {
    p_Var1 = pDecoder->pBackendVTable->onUninit;
    if (p_Var1 != (_func_void_void_ptr_ma_data_source_ptr_ma_allocation_callbacks_ptr *)0x0) {
      (*p_Var1)(pDecoder->pBackendUserData,&pDecoder->pBackend,pDst);
      return mVar2;
    }
    return mVar2;
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_decoder_init_memory(const void* pData, size_t dataSize, const ma_decoder_config* pConfig, ma_decoder* pDecoder)
{
    ma_result result;
    ma_decoder_config config;

    config = ma_decoder_config_init_copy(pConfig);

    result = ma_decoder__preinit(NULL, NULL, NULL, NULL, &config, pDecoder);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (pData == NULL || dataSize == 0) {
        return MA_INVALID_ARGS;
    }

    /* If the backend has support for loading from a file path we'll want to use that. If that all fails we'll fall back to the VFS path. */
    result = MA_NO_BACKEND;

    if (config.encodingFormat != ma_encoding_format_unknown) {
    #ifdef MA_HAS_WAV
        if (config.encodingFormat == ma_encoding_format_wav) {
            result = ma_decoder_init_wav_from_memory__internal(pData, dataSize, &config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_FLAC
        if (config.encodingFormat == ma_encoding_format_flac) {
            result = ma_decoder_init_flac_from_memory__internal(pData, dataSize, &config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_MP3
        if (config.encodingFormat == ma_encoding_format_mp3) {
            result = ma_decoder_init_mp3_from_memory__internal(pData, dataSize, &config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_VORBIS
        if (config.encodingFormat == ma_encoding_format_vorbis) {
            result = ma_decoder_init_vorbis_from_memory__internal(pData, dataSize, &config, pDecoder);
        }
    #endif
    }

    if (result != MA_SUCCESS) {
        /* Getting here means we weren't able to initialize a decoder of a specific encoding format. */

        /*
        We use trial and error to open a decoder. We prioritize custom decoders so that if they
        implement the same encoding format they take priority over the built-in decoders.
        */
        result = ma_decoder_init_custom_from_memory__internal(pData, dataSize, &config, pDecoder);

        /*
        If we get to this point and we still haven't found a decoder, and the caller has requested a
        specific encoding format, there's no hope for it. Abort.
        */
        if (result != MA_SUCCESS && config.encodingFormat != ma_encoding_format_unknown) {
            return MA_NO_BACKEND;
        }

        /* Use trial and error for stock decoders. */
        if (result != MA_SUCCESS) {
        #ifdef MA_HAS_WAV
            if (result != MA_SUCCESS) {
                result = ma_decoder_init_wav_from_memory__internal(pData, dataSize, &config, pDecoder);
            }
        #endif
        #ifdef MA_HAS_FLAC
            if (result != MA_SUCCESS) {
                result = ma_decoder_init_flac_from_memory__internal(pData, dataSize, &config, pDecoder);
            }
        #endif
        #ifdef MA_HAS_MP3
            if (result != MA_SUCCESS) {
                result = ma_decoder_init_mp3_from_memory__internal(pData, dataSize, &config, pDecoder);
            }
        #endif
        #ifdef MA_HAS_VORBIS
            if (result != MA_SUCCESS) {
                result = ma_decoder_init_vorbis_from_memory__internal(pData, dataSize, &config, pDecoder);
            }
        #endif
        }
    }

    /*
    If at this point we still haven't successfully initialized the decoder it most likely means
    the backend doesn't have an implementation for loading from a file path. We'll try using
    miniaudio's built-in file IO for loading file.
    */
    if (result == MA_SUCCESS) {
        /* Initialization was successful. Finish up. */
        result = ma_decoder__postinit(&config, pDecoder);
        if (result != MA_SUCCESS) {
            /*
            The backend was initialized successfully, but for some reason post-initialization failed. This is most likely
            due to an out of memory error. We're going to abort with an error here and not try to recover.
            */
            if (pDecoder->pBackendVTable != NULL && pDecoder->pBackendVTable->onUninit != NULL) {
                pDecoder->pBackendVTable->onUninit(pDecoder->pBackendUserData, &pDecoder->pBackend, &pDecoder->allocationCallbacks);
            }

            return result;
        }
    } else {
        /* Probably no implementation for loading from a block of memory. Use miniaudio's abstraction instead. */
        result = ma_decoder__preinit_memory_wrapper(pData, dataSize, &config, pDecoder);
        if (result != MA_SUCCESS) {
            return result;
        }

        result = ma_decoder_init__internal(ma_decoder__on_read_memory, ma_decoder__on_seek_memory, NULL, &config, pDecoder);
        if (result != MA_SUCCESS) {
            return result;
        }
    }

    return MA_SUCCESS;
}